

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O2

xml_output * attrS(xml_output *__return_storage_ptr__,char *name,QString *v)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((v->d).size == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      noxml();
      return __return_storage_ptr__;
    }
  }
  else {
    QString::QString((QString *)&QStack_38,name);
    attribute(__return_storage_ptr__,(QString *)&QStack_38,v);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

inline XmlOutput::xml_output attrS(const char *name, const QString &v)
{
    if(v.isEmpty())
        return noxml();
    return attr(name, v);
}